

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  Char *pCVar1;
  size_t sVar2;
  IMemoryAllocator *Allocator;
  TLASBuildInstanceData *pTVar3;
  BottomLevelASVkImpl *pBVar4;
  undefined4 in_register_0000000c;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
  Args_1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>,_bool>
  pVar5;
  Uint32 local_180;
  undefined1 local_118 [8];
  string msg_1;
  undefined1 local_d0 [7];
  bool IsUniqueName;
  InstanceDesc Desc;
  char *NameCopy;
  TLASBuildInstanceData *Inst;
  Uint32 i_1;
  Uint32 InstanceOffset;
  string msg;
  size_t sStack_78;
  Uint32 i;
  size_t StringPoolSize;
  HIT_GROUP_BINDING_MODE BindingMode_local;
  Uint32 HitGroupStride_local;
  Uint32 BaseContributionToHitGroupIndex_local;
  Uint32 InstanceCount_local;
  TLASBuildInstanceData *pInstances_local;
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  Args_1._M_cur = (__node_type *)CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex);
  ClearInstanceData(this);
  sStack_78 = 0;
  for (msg.field_2._12_4_ = 0; (uint)msg.field_2._12_4_ < InstanceCount;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
    if (pInstances[(uint)msg.field_2._12_4_].InstanceName == (Char *)0x0) {
      FormatString<char[26],char[38]>
                ((string *)&i_1,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"pInstances[i].InstanceName != nullptr",
                 (char (*) [38])((ulong)(uint)msg.field_2._12_4_ * 0x50));
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"SetInstanceData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0x72);
      std::__cxx11::string::~string((string *)&i_1);
    }
    Args_1._M_cur = (__node_type *)((ulong)(uint)msg.field_2._12_4_ * 0x50);
    sVar2 = StringPool::GetRequiredReserveSize(pInstances[(uint)msg.field_2._12_4_].InstanceName);
    sStack_78 = sVar2 + sStack_78;
  }
  Allocator = GetRawAllocator();
  StringPool::Reserve(&this->m_StringPool,sStack_78,Allocator);
  Inst._4_4_ = BaseContributionToHitGroupIndex;
  for (Inst._0_4_ = 0; (uint)Inst < InstanceCount; Inst._0_4_ = (uint)Inst + 1) {
    pTVar3 = pInstances + (uint)Inst;
    Desc._16_8_ = StringPool::CopyString(&this->m_StringPool,pTVar3->InstanceName);
    local_d0._0_4_ = 0;
    stack0xffffffffffffff34 = 0;
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&Desc);
    Desc.pBLAS.m_pObject._0_4_ = 0;
    pBVar4 = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(pTVar3->pBLAS);
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=
              ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&Desc,pBVar4);
    local_d0._0_4_ = pTVar3->ContributionToHitGroupIndex;
    stack0xffffffffffffff34 = (uint)Inst;
    CalculateHitGroupIndex
              ((InstanceDesc *)local_d0,(Uint32 *)((long)&Inst + 4),HitGroupStride,BindingMode);
    pBVar4 = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->
                       ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&Desc);
    Desc.pBLAS.m_pObject._0_4_ =
         BottomLevelASBase<Diligent::EngineVkImplTraits>::DvpGetVersion
                   (&pBVar4->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
    pVar5 = std::
            unordered_map<Diligent::HashMapStringKey,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>>
            ::
            emplace<char_const*&,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc&>
                      ((unordered_map<Diligent::HashMapStringKey,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>>
                        *)&this->m_Instances,(char **)&Desc.dvpVersion,(InstanceDesc *)local_d0);
    msg_1.field_2._8_8_ =
         pVar5.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
         ._M_cur;
    Args_1._M_cur = (__node_type *)msg_1.field_2._8_8_;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      Args_1._M_cur = (__node_type *)0x8a;
      LogError<true,char[30]>
                (false,"SetInstanceData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0x8a,(char (*) [30])"Instance name must be unique!");
    }
    InstanceDesc::~InstanceDesc((InstanceDesc *)local_d0);
  }
  sVar2 = StringPool::GetRemainingSize(&this->m_StringPool);
  if (sVar2 != 0) {
    FormatString<char[26],char[43]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_StringPool.GetRemainingSize() == 0",
               (char (*) [43])Args_1._M_cur);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"SetInstanceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x8d);
    std::__cxx11::string::~string((string *)local_118);
  }
  local_180 = HitGroupStride;
  if (BindingMode != HIT_GROUP_BINDING_MODE_PER_TLAS) {
    local_180 = 0;
  }
  (this->m_BuildInfo).HitGroupStride = HitGroupStride;
  (this->m_BuildInfo).FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
  (this->m_BuildInfo).LastContributionToHitGroupIndex = (Inst._4_4_ - 1) + local_180;
  (this->m_BuildInfo).BindingMode = BindingMode;
  (this->m_BuildInfo).InstanceCount = InstanceCount;
  LOCK();
  (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
       (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return true;
}

Assistant:

bool SetInstanceData(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        try
        {
            ClearInstanceData();

            size_t StringPoolSize = 0;
            for (Uint32 i = 0; i < InstanceCount; ++i)
            {
                VERIFY_EXPR(pInstances[i].InstanceName != nullptr);
                StringPoolSize += StringPool::GetRequiredReserveSize(pInstances[i].InstanceName);
            }

            this->m_StringPool.Reserve(StringPoolSize, GetRawAllocator());

            Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

            for (Uint32 i = 0; i < InstanceCount; ++i)
            {
                const auto&  Inst     = pInstances[i];
                const char*  NameCopy = this->m_StringPool.CopyString(Inst.InstanceName);
                InstanceDesc Desc     = {};

                Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
                Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
                Desc.InstanceIndex               = i;
                CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
                Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
                bool IsUniqueName = this->m_Instances.emplace(NameCopy, Desc).second;
                if (!IsUniqueName)
                    LOG_ERROR_AND_THROW("Instance name must be unique!");
            }

            VERIFY_EXPR(this->m_StringPool.GetRemainingSize() == 0);

            InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

            this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
            this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
            this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
            this->m_BuildInfo.BindingMode                      = BindingMode;
            this->m_BuildInfo.InstanceCount                    = InstanceCount;

#ifdef DILIGENT_DEVELOPMENT
            this->m_DvpVersion.fetch_add(1);
#endif
            return true;
        }
        catch (...)
        {
#ifdef DILIGENT_DEVELOPMENT
            this->m_DvpVersion.fetch_add(1);
#endif
            ClearInstanceData();
            return false;
        }
    }